

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

ConstraintDB * __thiscall Clasp::Solver::allocUndo(Solver *this,Constraint *c)

{
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this_00;
  allocator_type local_19;
  Constraint *c_local;
  
  this_00 = this->undoHead_;
  c_local = c;
  if (this_00 == (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)0x0) {
    this_00 = (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
              operator_new(0x10);
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pod_vector
              (this_00,1,&c_local,&local_19);
  }
  else {
    this->undoHead_ = (ConstraintDB *)*(this_00->ebo_).buf;
    (this_00->ebo_).size = 0;
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              (this_00,&c_local);
  }
  return this_00;
}

Assistant:

Solver::ConstraintDB* Solver::allocUndo(Constraint* c) {
	if (undoHead_ == 0) {
		return new ConstraintDB(1, c);
	}
	assert(undoHead_->size() == 1);
	ConstraintDB* r = undoHead_;
	undoHead_ = (ConstraintDB*)undoHead_->front();
	r->clear();
	r->push_back(c);
	return r;
}